

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.hpp
# Opt level: O2

bool tf::has_env(string *str)

{
  char *pcVar1;
  
  pcVar1 = getenv((str->_M_dataplus)._M_p);
  return pcVar1 != (char *)0x0;
}

Assistant:

inline bool has_env(const std::string& str) {
#ifdef _MSC_VER
  char *ptr = nullptr;
  size_t len = 0;

  if(_dupenv_s(&ptr, &len, str.c_str()) == 0 && ptr != nullptr) {
    std::string res(ptr, len);
    std::free(ptr);
    return true;
  }
  return false;

#else
  auto ptr = std::getenv(str.c_str());
  return ptr ? true : false;
#endif
}